

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestSampleResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vector<float,_4> *result)

{
  WrapMode WVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  float fVar9;
  undefined1 local_80 [8];
  Vector<float,_4> color;
  int y;
  int x;
  int i;
  int j;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<float,_4> *result_local;
  int coordZ_local;
  Vec2 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  fVar9 = Vector<float,_2>::x(coord);
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),iVar3,fVar9,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  fVar9 = Vector<float,_2>::y(coord);
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),iVar3,fVar9,iVar4,iVar5);
  fVar9 = Vector<float,_2>::x(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::y(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  x = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar8 = deFloorFloatToInt32(fVar9);
  do {
    y = dVar6;
    if (dVar8 < x) {
      return false;
    }
    for (; y <= dVar7; y = y + 1) {
      WVar1 = sampler->wrapS;
      iVar3 = ConstPixelBufferAccess::getWidth(level);
      color.m_data[3] = (float)TexVerifierUtil::wrap(WVar1,y,iVar3);
      WVar1 = sampler->wrapT;
      iVar3 = ConstPixelBufferAccess::getHeight(level);
      color.m_data[2] = (float)TexVerifierUtil::wrap(WVar1,x,iVar3);
      lookup<float>((tcu *)local_80,level,sampler,(int)color.m_data[3],(int)color.m_data[2],coordZ);
      bVar2 = isColorValid(prec,(Vec4 *)local_80,result);
      if (bVar2) {
        return true;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const Vec2&							coord,
										const int							coordZ,
										const Vector<ScalarType, 4>&		result)
{
	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());
	const int		minJ			= deFloorFloatToInt32(vBounds.x());
	const int		maxJ			= deFloorFloatToInt32(vBounds.y());

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int					x		= wrap(sampler.wrapS, i, level.getWidth());
			const int					y		= wrap(sampler.wrapT, j, level.getHeight());
			const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, y, coordZ);

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}